

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O2

int32_t u8Index(UTrie2 *trie,UChar32 c,int32_t i)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint uVar4;
  
  if ((uint)c < 0xd800) {
    puVar3 = trie->index;
    uVar4 = (uint)c >> 5;
LAB_002c97a9:
    uVar1 = puVar3[uVar4];
  }
  else {
    if ((uint)c < 0x10000) {
      uVar4 = ((uint)c >> 5) + 0x140;
      if (0xdbff < (uint)c) {
        uVar4 = (uint)c >> 5;
      }
      puVar3 = trie->index;
      goto LAB_002c97a9;
    }
    if (0x10ffff < (uint)c) {
      iVar2 = 0x80;
      if (trie->data32 == (uint32_t *)0x0) {
        iVar2 = trie->indexLength + 0x80;
      }
      goto LAB_002c97b3;
    }
    if (trie->highStart <= c) {
      iVar2 = trie->highValueIndex;
      goto LAB_002c97b3;
    }
    uVar1 = trie->index[((uint)c >> 5 & 0x3f) + (uint)trie->index[(ulong)((uint)c >> 0xb) + 0x820]];
  }
  iVar2 = (c & 0x1fU) + (uint)uVar1 * 4;
LAB_002c97b3:
  return iVar2 << 3 | i;
}

Assistant:

static inline int32_t
u8Index(const UTrie2 *trie, UChar32 c, int32_t i) {
    int32_t idx=
        _UTRIE2_INDEX_FROM_CP(
            trie,
            trie->data32==NULL ? trie->indexLength : 0,
            c);
    return (idx<<3)|i;
}